

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O1

gme_err_t gme_identify_file(char *path,gme_type_t *type_out)

{
  bool bVar1;
  int iVar2;
  gme_type_t pgVar3;
  undefined4 extraout_var;
  gme_err_t pcVar5;
  char *extension_;
  size_t in_RCX;
  int __oflag;
  char header [4];
  Std_File_Reader in;
  undefined1 local_34 [4];
  Std_File_Reader local_30;
  gme_err_t pcVar4;
  
  pgVar3 = gme_identify_extension(path);
  *type_out = pgVar3;
  if (pgVar3 == (gme_type_t)0x0) {
    Std_File_Reader::Std_File_Reader(&local_30);
    iVar2 = Std_File_Reader::open(&local_30,path,__oflag);
    pcVar4 = (gme_err_t)CONCAT44(extraout_var,iVar2);
    pcVar5 = pcVar4;
    if ((pcVar4 == (gme_err_t)0x0) &&
       (pcVar5 = (gme_err_t)Std_File_Reader::read(&local_30,(int)local_34,(void *)0x4,in_RCX),
       pcVar5 == (gme_err_t)0x0)) {
      extension_ = gme_identify_header(local_34);
      pgVar3 = gme_identify_extension(extension_);
      *type_out = pgVar3;
      bVar1 = true;
    }
    else {
      bVar1 = false;
      pcVar4 = pcVar5;
    }
    Std_File_Reader::~Std_File_Reader(&local_30);
    if (!bVar1) {
      return pcVar4;
    }
  }
  return (gme_err_t)0x0;
}

Assistant:

BLARGG_EXPORT gme_err_t gme_identify_file( const char* path, gme_type_t* type_out )
{
	*type_out = gme_identify_extension( path );
	// TODO: don't examine header if file has extension?
	if ( !*type_out )
	{
		char header [4];
		GME_FILE_READER in;
		RETURN_ERR( in.open( path ) );
		RETURN_ERR( in.read( header, sizeof header ) );
		*type_out = gme_identify_extension( gme_identify_header( header ) );
	}
	return 0;   
}